

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  curl_slist *pcVar2;
  char *first;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  Curl_HttpReq CVar6;
  CURLcode CVar7;
  byte *pbVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  undefined7 in_register_00000031;
  char *second;
  curl_slist **ppcVar13;
  bool bVar14;
  long local_58;
  Curl_send_buffer *req_buffer_local;
  curl_slist *h [2];
  
  pCVar1 = conn->data;
  local_58 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    h[0] = (pCVar1->set).headers;
    if (((*(uint *)&(conn->bits).field_0x4 & 0x8040) == 0x40) &&
       (((pCVar1->set).field_0x8e8 & 0x10) != 0)) {
      h[1] = (pCVar1->set).proxyheaders;
      local_58 = 2;
    }
  }
  else {
    if (((pCVar1->set).field_0x8e8 & 0x10) == 0) {
      h[0] = (pCVar1->set).headers;
    }
    else {
      h[0] = (pCVar1->set).proxyheaders;
    }
  }
  lVar10 = 0;
  req_buffer_local = req_buffer;
  do {
    if (lVar10 == local_58) {
      return CURLE_OK;
    }
    ppcVar13 = h + lVar10;
    while (pcVar2 = *ppcVar13, pcVar2 != (curl_slist *)0x0) {
      pcVar9 = pcVar2->data;
      pbVar8 = (byte *)strchr(pcVar9,0x3a);
      if (pbVar8 == (byte *)0x0) {
        pbVar8 = (byte *)strchr(pcVar9,0x3b);
        pbVar3 = pbVar8;
        pbVar4 = pbVar8;
        if (pbVar8 != (byte *)0x0) {
          do {
            pbVar12 = pbVar4;
            pbVar11 = pbVar3;
            if (pbVar12[1] == 0) goto LAB_00112816;
            iVar5 = Curl_isspace((uint)pbVar12[1]);
            pbVar3 = pbVar11 + 1;
            pbVar4 = pbVar12 + 1;
          } while (iVar5 != 0);
          if (pbVar12[1] == 0) {
LAB_00112816:
            if (*pbVar12 != 0x3b) goto LAB_00112697;
            pcVar9 = (*Curl_cstrdup)(pcVar2->data);
            if (pcVar9 == (char *)0x0) {
              Curl_add_buffer_free(&req_buffer_local);
              return CURLE_OUT_OF_MEMORY;
            }
            pbVar11[(long)pcVar9 - (long)pcVar2->data] = 0x3a;
            pbVar8 = pbVar11 + ((long)pcVar9 - (long)pcVar2->data);
            goto LAB_0011269d;
          }
        }
      }
      else {
LAB_00112697:
        pcVar9 = (char *)0x0;
LAB_0011269d:
        do {
          pbVar8 = pbVar8 + 1;
          if (*pbVar8 == 0) {
            bVar14 = false;
            goto LAB_001126be;
          }
          iVar5 = Curl_isspace((uint)*pbVar8);
        } while (iVar5 != 0);
        bVar14 = *pbVar8 != 0;
LAB_001126be:
        if ((pcVar9 != (char *)0x0) || (bVar14)) {
          second = pcVar9;
          if (pcVar9 == (char *)0x0) {
            second = pcVar2->data;
          }
          if (((conn->allocptr).host == (char *)0x0) ||
             (iVar5 = curl_strnequal("Host:",second,5), iVar5 == 0)) {
            CVar6 = (pCVar1->set).httpreq;
            if (CVar6 == HTTPREQ_POST_FORM) {
              iVar5 = curl_strnequal("Content-Type:",second,0xd);
              if (iVar5 != 0) goto LAB_001127b0;
              CVar6 = (pCVar1->set).httpreq;
            }
            if (((((CVar6 == HTTPREQ_POST_MIME) &&
                  (iVar5 = curl_strnequal("Content-Type:",second,0xd), iVar5 != 0)) ||
                 ((((conn->bits).field_0x6 & 1) != 0 &&
                  (iVar5 = curl_strnequal("Content-Length:",second,0xf), iVar5 != 0)))) ||
                ((((conn->allocptr).te != (char *)0x0 &&
                  (iVar5 = curl_strnequal("Connection:",second,0xb), iVar5 != 0)) ||
                 ((0x13 < conn->httpversion &&
                  (iVar5 = curl_strnequal("Transfer-Encoding:",second,0x12), iVar5 != 0)))))) ||
               ((((iVar5 = curl_strnequal("Authorization:",second,0xe), iVar5 != 0 ||
                  (iVar5 = curl_strnequal("Cookie:",second,7), iVar5 != 0)) &&
                 (((pCVar1->state).field_0x514 & 2) != 0)) &&
                (((first = (pCVar1->state).first_host, first != (char *)0x0 &&
                  (((pCVar1->set).field_0x8eb & 1) == 0)) &&
                 (iVar5 = Curl_strcasecompare(first,(conn->host).name), iVar5 == 0))))))
            goto LAB_001127b0;
            CVar7 = Curl_add_bufferf(&req_buffer_local,"%s\r\n",second);
          }
          else {
LAB_001127b0:
            CVar7 = CURLE_OK;
          }
          if (pcVar9 != (char *)0x0) {
            (*Curl_cfree)(pcVar9);
          }
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
        }
      }
      ppcVar13 = &pcVar2->next;
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
                Curl_add_buffer_free(&req_buffer);
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", compare);
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}